

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall
capnp::compiler::NodeTranslator::compileBootstrapValue
          (NodeTranslator *this,Reader source,Reader type,Builder target,Schema typeScope)

{
  Reader source_00;
  Reader RVar1;
  Builder BVar2;
  Which WVar3;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  Schema local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  UnfinishedValue local_108;
  SegmentBuilder *local_78;
  CapTableBuilder *pCStack_70;
  void *local_68;
  WirePointer *pWStack_60;
  StructDataBitCount local_58;
  StructPointerCount SStack_54;
  undefined2 uStack_52;
  SegmentReader *local_48;
  CapTableReader *pCStack_40;
  void *local_38;
  WirePointer *pWStack_30;
  StructDataBitCount local_28;
  StructPointerCount SStack_24;
  undefined2 uStack_22;
  int iStack_20;
  undefined4 uStack_1c;
  NodeTranslator *local_18;
  NodeTranslator *this_local;
  Schema typeScope_local;
  
  BVar2._builder = target._builder;
  RVar1._reader = type._reader;
  local_28 = type._reader.dataSize;
  SStack_24 = type._reader.pointerCount;
  uStack_22 = type._reader._38_2_;
  iStack_20 = type._reader.nestingLimit;
  uStack_1c = type._reader._44_4_;
  local_38 = type._reader.data;
  pWStack_30 = type._reader.pointers;
  local_48 = type._reader.segment;
  pCStack_40 = type._reader.capTable;
  local_58 = target._builder.dataSize;
  SStack_54 = target._builder.pointerCount;
  uStack_52 = target._builder._38_2_;
  local_68 = target._builder.data;
  pWStack_60 = target._builder.pointers;
  local_78 = target._builder.segment;
  pCStack_70 = target._builder.capTable;
  local_18 = this;
  this_local = (NodeTranslator *)typeScope.raw;
  compileDefaultDefaultValue(this,RVar1,BVar2);
  WVar3 = capnp::schema::Type::Reader::which(&type);
  if ((WVar3 == LIST) || (WVar3 - 0x10 < 3)) {
    memcpy(&local_108,&source,0x30);
    memcpy(&local_108.type,&type,0x30);
    local_108.typeScope.raw = (RawBrandedSchema *)this_local;
    memcpy(&local_108.target,&target,0x28);
    kj::Vector<capnp::compiler::NodeTranslator::UnfinishedValue>::
    add<capnp::compiler::NodeTranslator::UnfinishedValue>(&this->unfinishedValues,&local_108);
  }
  else {
    memcpy(&local_138,&source,0x30);
    memcpy(&local_168,&type,0x30);
    local_170.raw = (RawBrandedSchema *)this_local;
    memcpy(&local_198,&target,0x28);
    source_00._reader.capTable = (CapTableReader *)uStack_130;
    source_00._reader.segment = (SegmentReader *)local_138;
    source_00._reader.data = (void *)local_128;
    source_00._reader.pointers = (WirePointer *)uStack_120;
    source_00._reader.dataSize = (undefined4)local_118;
    source_00._reader.pointerCount = local_118._4_2_;
    source_00._reader._38_2_ = local_118._6_2_;
    source_00._reader._40_8_ = uStack_110;
    RVar1._reader.capTable = (CapTableReader *)uStack_160;
    RVar1._reader.segment = (SegmentReader *)local_168;
    RVar1._reader.data = (void *)local_158;
    RVar1._reader.pointers = (WirePointer *)uStack_150;
    RVar1._reader.dataSize = (undefined4)local_148;
    RVar1._reader.pointerCount = local_148._4_2_;
    RVar1._reader._38_2_ = local_148._6_2_;
    RVar1._reader._40_8_ = uStack_140;
    BVar2._builder.capTable = (CapTableBuilder *)uStack_190;
    BVar2._builder.segment = (SegmentBuilder *)local_198;
    BVar2._builder.data = (void *)local_188;
    BVar2._builder.pointers = (WirePointer *)uStack_180;
    BVar2._builder.dataSize = (undefined4)local_178;
    BVar2._builder.pointerCount = local_178._4_2_;
    BVar2._builder._38_2_ = local_178._6_2_;
    compileValue(this,source_00,RVar1,local_170,BVar2,true);
  }
  return;
}

Assistant:

void NodeTranslator::compileBootstrapValue(
    Expression::Reader source, schema::Type::Reader type, schema::Value::Builder target,
    Schema typeScope) {
  // Start by filling in a default default value so that if for whatever reason we don't end up
  // initializing the value, this won't cause schema validation to fail.
  compileDefaultDefaultValue(type, target);

  switch (type.which()) {
    case schema::Type::LIST:
    case schema::Type::STRUCT:
    case schema::Type::INTERFACE:
    case schema::Type::ANY_POINTER:
      unfinishedValues.add(UnfinishedValue { source, type, typeScope, target });
      break;

    default:
      // Primitive value.
      compileValue(source, type, typeScope, target, true);
      break;
  }
}